

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O0

bool Rml::Initialise(void)

{
  code *pcVar1;
  bool bVar2;
  CoreData *pCVar3;
  type this;
  unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> local_40;
  unique_ptr<Rml::TextInputHandler,_std::default_delete<Rml::TextInputHandler>_> local_38;
  unique_ptr<Rml::FontEngineInterfaceDefault,_std::default_delete<Rml::FontEngineInterfaceDefault>_>
  local_30;
  unique_ptr<Rml::FileInterfaceDefault,_std::default_delete<Rml::FileInterfaceDefault>_>
  local_28 [3];
  unique_ptr<Rml::SystemInterface,_std::default_delete<Rml::SystemInterface>_> local_10;
  
  if (((initialised & 1) != 0) &&
     (bVar2 = Assert("Rml::Initialise() called, but RmlUi is already initialised!",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Core.cpp"
                     ,0x6f), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  InitializeMemoryPools();
  InitializeComputeProperty();
  ControlledLifetimeResource<Rml::CoreData>::Initialize
            ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
  if (system_interface == (pointer)0x0) {
    MakeUnique<Rml::SystemInterface>();
    pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    ::std::unique_ptr<Rml::SystemInterface,_std::default_delete<Rml::SystemInterface>_>::operator=
              (&pCVar3->default_system_interface,&local_10);
    ::std::unique_ptr<Rml::SystemInterface,_std::default_delete<Rml::SystemInterface>_>::~unique_ptr
              (&local_10);
    pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    system_interface =
         ::std::unique_ptr<Rml::SystemInterface,_std::default_delete<Rml::SystemInterface>_>::get
                   (&pCVar3->default_system_interface);
  }
  if (file_interface == (pointer)0x0) {
    MakeUnique<Rml::FileInterfaceDefault>();
    pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    ::std::unique_ptr<Rml::FileInterface,std::default_delete<Rml::FileInterface>>::operator=
              ((unique_ptr<Rml::FileInterface,std::default_delete<Rml::FileInterface>> *)
               &pCVar3->default_file_interface,local_28);
    ::std::unique_ptr<Rml::FileInterfaceDefault,_std::default_delete<Rml::FileInterfaceDefault>_>::
    ~unique_ptr(local_28);
    pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    file_interface =
         ::std::unique_ptr<Rml::FileInterface,_std::default_delete<Rml::FileInterface>_>::get
                   (&pCVar3->default_file_interface);
  }
  if (font_interface == (pointer)0x0) {
    MakeUnique<Rml::FontEngineInterfaceDefault>();
    pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    ::std::unique_ptr<Rml::FontEngineInterface,std::default_delete<Rml::FontEngineInterface>>::
    operator=((unique_ptr<Rml::FontEngineInterface,std::default_delete<Rml::FontEngineInterface>> *)
              &pCVar3->default_font_interface,&local_30);
    ::std::
    unique_ptr<Rml::FontEngineInterfaceDefault,_std::default_delete<Rml::FontEngineInterfaceDefault>_>
    ::~unique_ptr(&local_30);
    pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    font_interface =
         ::std::unique_ptr<Rml::FontEngineInterface,_std::default_delete<Rml::FontEngineInterface>_>
         ::get(&pCVar3->default_font_interface);
  }
  if (text_input_handler == (pointer)0x0) {
    MakeUnique<Rml::TextInputHandler>();
    pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    ::std::unique_ptr<Rml::TextInputHandler,_std::default_delete<Rml::TextInputHandler>_>::operator=
              (&pCVar3->default_text_input_handler,&local_38);
    ::std::unique_ptr<Rml::TextInputHandler,_std::default_delete<Rml::TextInputHandler>_>::
    ~unique_ptr(&local_38);
    pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    text_input_handler =
         ::std::unique_ptr<Rml::TextInputHandler,_std::default_delete<Rml::TextInputHandler>_>::get
                   (&pCVar3->default_text_input_handler);
  }
  EventSpecificationInterface::Initialize();
  Detail::InitializeObserverPtrPool();
  if (render_interface != 0) {
    MakeUnique<Rml::RenderManager,Rml::RenderInterface*&>((RenderInterface **)&local_40);
    pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    this = itlib::
           flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
           ::operator[]<Rml::RenderInterface*&>
                     ((flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
                       *)&pCVar3->render_managers,(RenderInterface **)&render_interface);
    ::std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::operator=
              (this,&local_40);
    ::std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::~unique_ptr
              (&local_40);
  }
  (*font_interface->_vptr_FontEngineInterface[2])();
  StyleSheetSpecification::Initialise();
  StyleSheetParser::Initialise();
  StyleSheetFactory::Initialise();
  TemplateCache::Initialise();
  Factory::Initialise();
  PluginRegistry::NotifyInitialise();
  initialised = 1;
  return true;
}

Assistant:

bool Initialise()
{
	RMLUI_ASSERTMSG(!initialised, "Rml::Initialise() called, but RmlUi is already initialised!");

	InitializeMemoryPools();
	InitializeComputeProperty();

	core_data.Initialize();

	// Install default interfaces as appropriate.
	if (!system_interface)
	{
		core_data->default_system_interface = MakeUnique<SystemInterface>();
		system_interface = core_data->default_system_interface.get();
	}

	if (!file_interface)
	{
#ifndef RMLUI_NO_FILE_INTERFACE_DEFAULT
		core_data->default_file_interface = MakeUnique<FileInterfaceDefault>();
		file_interface = core_data->default_file_interface.get();
#else
		Log::Message(Log::LT_ERROR, "No file interface set!");
		return false;
#endif
	}

	if (!font_interface)
	{
#ifdef RMLUI_FONT_ENGINE_FREETYPE
		core_data->default_font_interface = MakeUnique<FontEngineInterfaceDefault>();
		font_interface = core_data->default_font_interface.get();
#else
		Log::Message(Log::LT_ERROR, "No font engine interface set!");
		return false;
#endif
	}

	if (!text_input_handler)
	{
		core_data->default_text_input_handler = MakeUnique<TextInputHandler>();
		text_input_handler = core_data->default_text_input_handler.get();
	}

	EventSpecificationInterface::Initialize();

	Detail::InitializeObserverPtrPool();

	if (render_interface)
		core_data->render_managers[render_interface] = MakeUnique<RenderManager>(render_interface);

	font_interface->Initialize();

	StyleSheetSpecification::Initialise();
	StyleSheetParser::Initialise();
	StyleSheetFactory::Initialise();

	TemplateCache::Initialise();

	Factory::Initialise();

	// Initialise plugins integrated with Core.
#ifdef RMLUI_LOTTIE_PLUGIN
	Lottie::Initialise();
#endif
#ifdef RMLUI_SVG_PLUGIN
	SVG::Initialise();
#endif

	// Notify all plugins we're starting up.
	PluginRegistry::NotifyInitialise();

	initialised = true;

	return true;
}